

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

string * format_system_error_abi_cxx11_(int error_code,string_view message)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_RDI;
  int in_stack_0000004c;
  memory_buffer out;
  allocator<char> *in_stack_fffffffffffffd78;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  allocator<char> local_239 [569];
  
  this = in_RDI;
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (this,in_stack_fffffffffffffd78);
  std::allocator<char>::~allocator(local_239);
  fmt::v5::format_system_error((buffer *)out._0_8_,in_stack_0000004c,(string_view)out._8_16_);
  fmt::v5::to_string<char,500ul>(in_stack_fffffffffffffdb8);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return (string *)in_RDI;
}

Assistant:

std::string format_system_error(int error_code, fmt::string_view message) {
  fmt::memory_buffer out;
  format_system_error(out, error_code, message);
  return to_string(out);
}